

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::
MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::ValueReader,_args::detail::unordered_map>
::MapPositional(MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::ValueReader,_args::detail::unordered_map>
                *this,Group *group_,string *name_,string *help_,
               unordered_map<std::__cxx11::basic_string<char>,_MappingEnum> *map_,
               MappingEnum *defaultValue_,Options options_)

{
  size_t sVar1;
  undefined4 uVar2;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>_>_>
  local_30;
  
  NamedBase::NamedBase((NamedBase *)this,name_,help_,options_);
  (this->super_PositionalBase).super_NamedBase.field_0x99 = 1;
  (this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__MapPositional_0021fd78;
  local_30._M_h = (__hashtable_alloc *)&this->map;
  (this->map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->map)._M_h._M_bucket_count = (map_->_M_h)._M_bucket_count;
  (this->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map)._M_h._M_element_count = (map_->_M_h)._M_element_count;
  uVar2 = *(undefined4 *)&(map_->_M_h)._M_rehash_policy.field_0x4;
  sVar1 = (map_->_M_h)._M_rehash_policy._M_next_resize;
  (this->map)._M_h._M_rehash_policy._M_max_load_factor =
       (map_->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->map)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->map)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MappingEnum>,std::allocator<std::pair<std::__cxx11::string_const,MappingEnum>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MappingEnum>,std::allocator<std::pair<std::__cxx11::string_const,MappingEnum>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,MappingEnum>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MappingEnum>,std::allocator<std::pair<std::__cxx11::string_const,MappingEnum>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_30._M_h,&map_->_M_h,&local_30);
  this->value = *defaultValue_;
  this->defaultValue = *defaultValue_;
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

MapPositional(Group &group_, const std::string &name_, const std::string &help_, const Map<K, T> &map_, const T &defaultValue_ = T(), Options options_ = {}):
                PositionalBase(name_, help_, options_), map(map_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }